

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::QueryBufferStorageTestCase::execute
          (QueryBufferStorageTestCase *this,GLuint sparse_bo_storage_flags)

{
  ostringstream *this_00;
  bool bVar1;
  GLboolean GVar2;
  GLenum GVar3;
  Functions *pFVar4;
  ulong *puVar5;
  int line;
  int iVar6;
  char *msg;
  GLuint GVar7;
  bool bVar8;
  undefined1 auStack_1b0 [120];
  ios_base aiStack_138 [264];
  
  (*this->m_gl->bindBuffer)(0x8f36,this->m_sparse_bo);
  GVar3 = (*this->m_gl->getError)();
  glu::checkError(GVar3,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x117d);
  (*this->m_gl->useProgram)(this->m_po);
  GVar3 = (*this->m_gl->getError)();
  glu::checkError(GVar3,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1180);
  bVar1 = true;
  bVar8 = true;
  GVar2 = '\x01';
LAB_00a4a0e3:
  (*this->m_gl->bufferPageCommitmentARB)(0x9192,0,(ulong)this->m_sparse_bo_size_rounded,GVar2);
  GVar3 = (*this->m_gl->getError)();
  glu::checkError(GVar3,"glBufferPageCommitmentARB() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x118e);
  (*this->m_gl->beginQuery)(0x8c87,this->m_qo);
  GVar3 = (*this->m_gl->getError)();
  glu::checkError(GVar3,"glBeginQuery() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1192);
  (*this->m_gl->drawArrays)(4,0,this->m_n_triangles * 3);
  GVar3 = (*this->m_gl->getError)();
  glu::checkError(GVar3,"glDrawArrays() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1196);
  (*this->m_gl->endQuery)(0x8c87);
  GVar3 = (*this->m_gl->getError)();
  glu::checkError(GVar3,"glEndQuery() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1199);
  iVar6 = 0;
  (*this->m_gl->getQueryObjectiv)(this->m_qo,0x8866,(GLint *)0x0);
  GVar3 = (*this->m_gl->getError)();
  msg = "glGetQueryObjectiv() call failed.";
  line = 0x11a3;
  do {
    glu::checkError(GVar3,msg,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,line);
    if (bVar8) {
      (*this->m_gl->bindBuffer)(0x8f37,this->m_helper_bo);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glBindBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x11cc);
      (*this->m_gl->copyBufferSubData)(0x8f36,0x8f37,0,0,4);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glCopyBufferSubData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x11d1);
      puVar5 = (ulong *)(*this->m_gl->mapBuffer)(0x8f37,35000);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glMapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x11d5);
      if (*puVar5 != (ulong)this->m_n_triangles) {
        auStack_1b0._0_8_ = this->m_testCtx->m_log;
        this_00 = (ostringstream *)(auStack_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Invalid query result stored in a sparse buffer. Expected:[",
                   0x3a);
        std::ostream::_M_insert<long>((long)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], expected:[",0xd);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)auStack_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(aiStack_138);
        bVar1 = false;
      }
      (*this->m_gl->unmapBuffer)(0x8f37);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glUnmapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x11e5);
      (*this->m_gl->clearBufferData)(0x8f37,0x8229,0x1903,0x1401,"");
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glClearBufferData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x11e8);
      if (iVar6 == 3) break;
      pFVar4 = this->m_gl;
      GVar7 = this->m_qo;
    }
    else {
      if (iVar6 == 3) {
        return bVar1;
      }
      pFVar4 = this->m_gl;
      GVar7 = this->m_qo;
    }
    iVar6 = iVar6 + 1;
    (*pFVar4->getQueryObjectuiv)(GVar7,0x8866,(GLuint *)0x0);
    GVar3 = (*this->m_gl->getError)();
    msg = "glGetQueryObjectuiv() call failed.";
    line = 0x11ab;
  } while( true );
  bVar8 = false;
  GVar2 = '\0';
  goto LAB_00a4a0e3;
}

Assistant:

bool QueryBufferStorageTestCase::execute(glw::GLuint sparse_bo_storage_flags)
{
	(void)sparse_bo_storage_flags;
	static const unsigned char data_r8_zero = 0;
	bool					   result		= true;

	m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_sparse_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	m_gl.useProgram(m_po);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUseProgram() call failed.");

	/* Run two separate iterations:
	 *
	 * a) The page holding the query result value is committed.
	 * b) The page is not committed.
	 */
	for (unsigned int n_iteration = 0; n_iteration < 2; ++n_iteration)
	{
		const bool should_commit_page = (n_iteration == 0);

		/* Set up the memory page commitment */
		m_gl.bufferPageCommitmentARB(GL_QUERY_BUFFER, 0, /* offset */
									 m_sparse_bo_size_rounded, should_commit_page ? GL_TRUE : GL_FALSE);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

		/* Run the draw call */
		m_gl.beginQuery(GL_PRIMITIVES_GENERATED, m_qo);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBeginQuery() call failed.");

		m_gl.drawArrays(GL_TRIANGLES, 0, /* first */
						m_n_triangles * 3);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDrawArrays() call failed.");

		m_gl.endQuery(GL_PRIMITIVES_GENERATED);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glEndQuery() call failed.");

		/* Copy the query result to the sparse buffer */
		for (unsigned int n_getter_call = 0; n_getter_call < 4; ++n_getter_call)
		{
			switch (n_getter_call)
			{
			case 0:
			{
				m_gl.getQueryObjectiv(m_qo, GL_QUERY_RESULT, (glw::GLint*)0); /* params */
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetQueryObjectiv() call failed.");

				break;
			}

			case 1:
			{
				m_gl.getQueryObjectuiv(m_qo, GL_QUERY_RESULT, (glw::GLuint*)0); /* params */
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetQueryObjectuiv() call failed.");

				break;
			}

			case 2:
			{
				m_gl.getQueryObjecti64v(m_qo, GL_QUERY_RESULT, (glw::GLint64*)0);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetQueryObjecti64v() call failed.");

				break;
			}

			case 3:
			{
				m_gl.getQueryObjectui64v(m_qo, GL_QUERY_RESULT, (glw::GLuint64*)0);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetQueryObjectui64v() call failed.");

				break;
			}

			default:
			{
				TCU_FAIL("Invalid getter call type");
			}
			} /* switch (n_getter_call) */

			/* Verify the query result */
			if (should_commit_page)
			{
				const glw::GLint64* result_ptr = NULL;

				m_gl.bindBuffer(GL_COPY_WRITE_BUFFER, m_helper_bo);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

				m_gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_COPY_WRITE_BUFFER, 0, /* readOffset */
									   0,											 /* writeOffset */
									   sizeof(unsigned int));
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

				result_ptr = (const glw::GLint64*)m_gl.mapBuffer(GL_COPY_WRITE_BUFFER, GL_READ_ONLY);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glMapBuffer() call failed.");

				if (*result_ptr != m_n_triangles)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid query result stored in a sparse buffer. Expected:"
										  "["
									   << *result_ptr << "]"
														 ", expected:"
														 "["
									   << m_n_triangles << "]" << tcu::TestLog::EndMessage;

					result = false;
				}

				m_gl.unmapBuffer(GL_COPY_WRITE_BUFFER);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUnmapBuffer() call failed.");

				m_gl.clearBufferData(GL_COPY_WRITE_BUFFER, GL_R8, GL_RED, GL_UNSIGNED_BYTE, &data_r8_zero);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClearBufferData() call failed.");
			} /* for (all query getter call types) */
		}	 /* if (should_commit_page) */
	}		  /* for (both iterations) */

	return result;
}